

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

int Abc_NtkMakeLegit(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pNode;
  uint uVar2;
  uint i;
  char *in_RSI;
  Abc_Ntk_t *pAVar3;
  
  if (pNtk->ntkFunc == ABC_FUNC_SOP) {
    uVar2 = 0;
    pAVar3 = pNtk;
    for (i = 0; (int)i < pNtk->vObjs->nSize; i = i + 1) {
      in_RSI = (char *)(ulong)i;
      pAVar3 = pNtk;
      pNode = (Abc_Ntk_t *)Abc_NtkObj(pNtk,i);
      if ((pNode != (Abc_Ntk_t *)0x0) && (((ulong)pNode->pSpec & 0xf00000000) == 0x700000000)) {
        iVar1 = Abc_NodeMakeLegit((Abc_Obj_t *)pNode);
        uVar2 = uVar2 + iVar1;
        pAVar3 = pNode;
      }
    }
    if (uVar2 != 0) {
      Abc_Print((int)pAVar3,in_RSI,(ulong)uVar2);
    }
    return 1;
  }
  __assert_fail("Abc_NtkHasSop(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                ,0x1d1,"int Abc_NtkMakeLegit(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkMakeLegit( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, Counter = 0;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += Abc_NodeMakeLegit( pNode );
    if ( Counter )
        Abc_Print( 0, "%d nodes were made dist1-cube-free and/or single-cube-containment-free.\n", Counter );
    return 1;
}